

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitI31Get
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,I31Get *curr)

{
  bool bVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_88;
  undefined8 local_78;
  undefined1 local_70 [8];
  Flow flow;
  
  visit((Flow *)local_70,this,*(Expression **)(curr + 0x10));
  if (flow.breakTo.super_IString.str._M_len == 0) {
    if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)local_70 != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    bVar1 = Type::isNull((Type *)&flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
                                  [0].field_0.func.super_IString.str._M_str);
    if (bVar1) {
      (*this->_vptr_ExpressionRunner[2])(this,"null ref");
    }
    local_88.i32 = Literal::geti31((Literal *)&flow,(bool)curr[0x18]);
    local_78 = 2;
    Flow::Flow(__return_storage_ptr__,(Literal *)&local_88.func);
    wasm::Literal::~Literal((Literal *)&local_88.func);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_70;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitI31Get(I31Get* curr) {
    NOTE_ENTER("I31Get");
    Flow flow = visit(curr->i31);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    if (value.isNull()) {
      trap("null ref");
    }
    return Literal(value.geti31(curr->signed_));
  }